

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_timer.c
# Opt level: O0

uint32_t cpu_mips_get_random_mipsel(CPUMIPSState_conflict4 *env)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t nb_rand_tlb;
  uint32_t idx;
  CPUMIPSState_conflict4 *env_local;
  
  uVar2 = env->tlb->nb_tlb - env->CP0_Wired;
  if (uVar2 == 1) {
    env_local._4_4_ = env->tlb->nb_tlb - 1;
    uVar1 = cpu_mips_get_random_mipsel::prev_idx;
  }
  else {
    do {
      cpu_mips_get_random_mipsel::seed = cpu_mips_get_random_mipsel::seed * 0x41c64e6d + 0x3039;
      env_local._4_4_ = (cpu_mips_get_random_mipsel::seed >> 0x10) % uVar2 + env->CP0_Wired;
      uVar1 = env_local._4_4_;
    } while (env_local._4_4_ == cpu_mips_get_random_mipsel::prev_idx);
  }
  cpu_mips_get_random_mipsel::prev_idx = uVar1;
  return env_local._4_4_;
}

Assistant:

uint32_t cpu_mips_get_random(CPUMIPSState *env)
{
    static uint32_t seed = 1;
    static uint32_t prev_idx = 0;
    uint32_t idx;
    uint32_t nb_rand_tlb = env->tlb->nb_tlb - env->CP0_Wired;

    if (nb_rand_tlb == 1) {
        return env->tlb->nb_tlb - 1;
    }

    /* Don't return same value twice, so get another value */
    do {
        /*
         * Use a simple algorithm of Linear Congruential Generator
         * from ISO/IEC 9899 standard.
         */
        seed = 1103515245 * seed + 12345;
        idx = (seed >> 16) % nb_rand_tlb + env->CP0_Wired;
    } while (idx == prev_idx);
    prev_idx = idx;
    return idx;
}